

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  void *__dest;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  piVar1 = strm->state;
  __dest = *(void **)&piVar1->gzindex;
  if (__dest == (void *)0x0) {
    __dest = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1->pending & 0x1f),1);
    *(void **)&piVar1->gzindex = __dest;
    if (__dest == (z_voidpf)0x0) {
      return 1;
    }
  }
  uVar5 = piVar1->wrap;
  if (uVar5 == 0) {
    uVar5 = 1 << ((byte)piVar1->pending & 0x1f);
    piVar1->wrap = uVar5;
    piVar1->gzhead = (gz_headerp)0x0;
  }
  uVar4 = out - strm->avail_out;
  if (uVar4 < uVar5) {
    uVar3 = *(uint *)((long)&piVar1->gzhead + 4);
    uVar5 = uVar5 - uVar3;
    uVar2 = uVar4;
    if (uVar5 < uVar4) {
      uVar2 = uVar5;
    }
    memcpy((void *)((long)__dest + (ulong)uVar3),strm->next_out + -(ulong)uVar4,(ulong)uVar2);
    if (uVar4 <= uVar5) {
      uVar3 = *(int *)((long)&piVar1->gzhead + 4) + uVar2;
      uVar5 = piVar1->wrap;
      uVar4 = *(uint *)&piVar1->gzhead;
      if (uVar3 == uVar5) {
        uVar3 = 0;
      }
      *(uint *)((long)&piVar1->gzhead + 4) = uVar3;
      if (uVar5 <= uVar4) {
        return 0;
      }
      *(uint *)&piVar1->gzhead = uVar4 + uVar2;
      return 0;
    }
    uVar4 = uVar4 - uVar2;
    memcpy(*(void **)&piVar1->gzindex,strm->next_out + -(ulong)uVar4,(ulong)uVar4);
    *(uint *)((long)&piVar1->gzhead + 4) = uVar4;
  }
  else {
    memcpy(__dest,strm->next_out + -(ulong)uVar5,(ulong)uVar5);
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
  }
  *(int *)&piVar1->gzhead = piVar1->wrap;
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->write = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->write = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->write;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->write, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->write = copy;
            state->whave = state->wsize;
        }
        else {
            state->write += dist;
            if (state->write == state->wsize) state->write = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}